

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

Iterator * __thiscall leveldb::Block::NewIterator(Block *this,Comparator *comparator)

{
  uint32_t uVar1;
  Slice *in_RDI;
  uint32_t num_restarts;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Iter *in_stack_ffffffffffffffc0;
  Iterator *local_8;
  
  if (in_RDI->size_ < 4) {
    Slice::Slice(in_RDI,in_stack_ffffffffffffffa8);
    Slice::Slice((Slice *)&stack0xffffffffffffffc0);
    Status::Corruption((Slice *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI
                      );
    local_8 = NewErrorIterator((Status *)in_RDI);
    Status::~Status((Status *)in_RDI);
  }
  else {
    uVar1 = NumRestarts((Block *)0x146603);
    if (uVar1 == 0) {
      local_8 = NewEmptyIterator();
    }
    else {
      local_8 = (Iterator *)operator_new(0x80);
      Iter::Iter(in_stack_ffffffffffffffc0,(Comparator *)CONCAT44(uVar1,in_stack_ffffffffffffffb8),
                 (char *)in_RDI,(uint32_t)((ulong)local_8 >> 0x20),(uint32_t)local_8);
    }
  }
  return local_8;
}

Assistant:

Iterator* Block::NewIterator(const Comparator* comparator) {
  if (size_ < sizeof(uint32_t)) {
    return NewErrorIterator(Status::Corruption("bad block contents"));
  }
  const uint32_t num_restarts = NumRestarts();
  if (num_restarts == 0) {
    return NewEmptyIterator();
  } else {
    return new Iter(comparator, data_, restart_offset_, num_restarts);
  }
}